

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib506.c
# Opt level: O1

void my_unlock(CURL *handle,curl_lock_data data,void *useptr)

{
  undefined *puVar1;
  uint uVar2;
  
  uVar2 = data - CURL_LOCK_DATA_SHARE;
  if (2 < uVar2) {
    curl_mfprintf(_stderr,"unlock: no such data: %d\n");
    return;
  }
  puVar1 = (&PTR_anon_var_dwarf_343_00103d88)[uVar2];
  if (locks[*(long *)(&DAT_001024e8 + (ulong)uVar2 * 8)] != 0) {
    locks[*(long *)(&DAT_001024e8 + (ulong)uVar2 * 8)] =
         locks[*(long *)(&DAT_001024e8 + (ulong)uVar2 * 8)] + -1;
    curl_mprintf("unlock: %-6s [%s]: %d\n",puVar1,*useptr,*(undefined4 *)((long)useptr + 8));
    *(int *)((long)useptr + 8) = *(int *)((long)useptr + 8) + 1;
    return;
  }
  curl_mprintf("unlock: double unlocked %s\n",puVar1);
  return;
}

Assistant:

static void my_unlock(CURL *handle, curl_lock_data data, void *useptr)
{
  const char *what;
  struct userdata *user = (struct userdata *)useptr;
  int locknum;
  (void)handle;
  switch(data) {
    case CURL_LOCK_DATA_SHARE:
      what = "share";
      locknum = 0;
      break;
    case CURL_LOCK_DATA_DNS:
      what = "dns";
      locknum = 1;
      break;
    case CURL_LOCK_DATA_COOKIE:
      what = "cookie";
      locknum = 2;
      break;
    default:
      fprintf(stderr, "unlock: no such data: %d\n", (int)data);
      return;
  }

  /* detect unlocking of unlocked locks */
  if(!locks[locknum]) {
    printf("unlock: double unlocked %s\n", what);
    return;
  }
  locks[locknum]--;

  printf("unlock: %-6s [%s]: %d\n", what, user->text, user->counter);
  user->counter++;
}